

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::updateMPF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  vector<double,_std::allocator<double>_> *this_00;
  iterator iVar1;
  iterator iVar2;
  pointer piVar3;
  int iVar4;
  int *piVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double local_70;
  int local_64;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,std::allocator<int>> *local_58;
  vector<double,std::allocator<double>> *local_50;
  ulong local_48;
  int *local_40;
  long local_38;
  
  local_60 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_60._4_4_,iRow);
  local_58 = (vector<int,std::allocator<int>> *)&this->PFindex;
  local_48 = (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_64 = iRow;
  local_40 = hint;
  if (0 < aq->packCount) {
    local_50 = (vector<double,std::allocator<double>> *)&this->PFvalue;
    lVar10 = 0;
    lVar11 = 0;
    lVar7 = 0;
    do {
      piVar5 = (int *)((long)(aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar11);
      iVar1._M_current =
           (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_58,iVar1,piVar5);
      }
      else {
        *iVar1._M_current = *piVar5;
        (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      pdVar6 = (double *)
               ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar10);
      iVar2._M_current =
           (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_50,iVar2,pdVar6);
      }
      else {
        *iVar2._M_current = *pdVar6;
        (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar7 = lVar7 + 1;
      lVar11 = lVar11 + 4;
      lVar10 = lVar10 + 8;
    } while (lVar7 < aq->packCount);
  }
  piVar3 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (long)(this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)local_60];
  iVar4 = piVar3[local_38];
  iVar9 = piVar3[local_38 + 1];
  if (iVar4 < iVar9) {
    lVar7 = (long)iVar4 << 2;
    iVar9 = iVar9 - iVar4;
    do {
      piVar5 = (int *)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7);
      iVar1._M_current =
           (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_58,iVar1,piVar5);
      }
      else {
        *iVar1._M_current = *piVar5;
        (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_70 = -*(double *)
                   ((long)(this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start + lVar7 * 2);
      iVar2._M_current =
           (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->PFvalue,iVar2,&local_70);
      }
      else {
        *iVar2._M_current = local_70;
        (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar7 = lVar7 + 4;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  iVar1._M_current =
       (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar1._M_current ==
      (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_58,iVar1,&local_64);
  }
  else {
    *iVar1._M_current = (int)local_60;
    (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  this_00 = &this->PFvalue;
  local_70 = -(this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_38];
  iVar2._M_current =
       (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(this_00,iVar2,&local_70)
    ;
  }
  else {
    *iVar2._M_current = local_70;
    (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_60 = &this->PFstart;
  iVar4 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_70 = (double)CONCAT44(local_70._4_4_,iVar4);
  iVar1._M_current =
       (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_50 = (vector<double,std::allocator<double>> *)this_00;
  if (iVar1._M_current ==
      (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar1,(int *)&local_70);
  }
  else {
    *iVar1._M_current = iVar4;
    (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  if (0 < ep->packCount) {
    lVar11 = 0;
    lVar7 = 0;
    lVar10 = 0;
    do {
      piVar5 = (int *)((long)(ep->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7);
      iVar1._M_current =
           (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_58,iVar1,piVar5);
      }
      else {
        *iVar1._M_current = *piVar5;
        (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      pdVar6 = (double *)
               ((long)(ep->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar11);
      iVar2._M_current =
           (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_50,iVar2,pdVar6);
      }
      else {
        *iVar2._M_current = *pdVar6;
        (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 4;
      lVar11 = lVar11 + 8;
    } while (lVar10 < ep->packCount);
  }
  iVar4 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_70 = (double)CONCAT44(local_70._4_4_,iVar4);
  iVar1._M_current =
       (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar1._M_current ==
      (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar1,(int *)&local_70);
  }
  else {
    *iVar1._M_current = iVar4;
    (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  pdVar6 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + local_64;
  uVar8 = local_48 >> 2;
  iVar2._M_current =
       (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->PFpivotValue,iVar2,pdVar6);
  }
  else {
    *iVar2._M_current = *pdVar6;
    (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar4 = ep->packCount + aq->packCount + this->UtotalX;
  this->UtotalX = iVar4;
  this->FtotalX =
       this->FtotalX +
       ((int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - (int)uVar8);
  if (this->UmeritX < iVar4) {
    *local_40 = 1;
  }
  return;
}

Assistant:

void HFactor::updateMPF(HVector *aq, HVector *ep, int iRow, int *hint) {
    int PFcountX0 = PFindex.size();

    // Store elements
    for (int i = 0; i < aq->packCount; i++) {
        PFindex.push_back(aq->packIndex[i]);
        PFvalue.push_back(aq->packValue[i]);
    }
    int pLogic = UpivotLookup[iRow];
    int UstartX = Ustart[pLogic];
    int UendX = Ustart[pLogic + 1];
    for (int k = UstartX; k < UendX; k++) {
        PFindex.push_back(Uindex[k]);
        PFvalue.push_back(-Uvalue[k]);
    }
    PFindex.push_back(iRow);
    PFvalue.push_back(-UpivotValue[pLogic]);
    PFstart.push_back(PFindex.size());

    for (int i = 0; i < ep->packCount; i++) {
        PFindex.push_back(ep->packIndex[i]);
        PFvalue.push_back(ep->packValue[i]);
    }
    PFstart.push_back(PFindex.size());

    // Store pivot
    PFpivotValue.push_back(aq->array[iRow]);

    // Refactor or not
    UtotalX += aq->packCount + ep->packCount;
    FtotalX += PFindex.size() - PFcountX0;
    if (UtotalX > UmeritX)
        *hint = 1;
}